

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

bool __thiscall TGAImage::write_tga_file(TGAImage *this,string *filename,bool v_flip,bool rle)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  uint8_t extension_area_ref [4];
  uint8_t developer_area_ref [4];
  uint8_t footer [18];
  TGA_Header header;
  ofstream out;
  undefined4 local_270;
  undefined4 local_26c;
  char local_268 [32];
  ulong local_248;
  long lStack_240;
  char local_238;
  char cStack_237;
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  local_26c = 0;
  local_270 = 0;
  builtin_strncpy(local_268,"TRUEVISION-XFILE.",0x12);
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::ofstream::close();
  }
  else {
    lStack_240 = (ulong)CONCAT22((short)this->height,(short)this->width) << 0x20;
    local_248 = (ulong)(byte)(rle * '\b' | this->bytespp == 1) << 0x10 | 0x20000;
    _local_238 = CONCAT11(!v_flip << 5,(char)this->bytespp * '\b');
    std::ostream::write((char *)&local_228,(long)&local_248);
    if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
      if (rle) {
        bVar2 = unload_rle_data(this,(ofstream *)&local_228);
        if (!bVar2) {
          std::ofstream::close();
          lVar4 = 0x16;
          pcVar5 = "can\'t unload rle data\n";
          goto LAB_0010433e;
        }
LAB_00104404:
        std::ostream::write((char *)&local_228,(long)&local_26c);
        lVar4 = 0x18;
        pcVar5 = "can\'t dump the tga file\n";
        if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
          std::ostream::write((char *)&local_228,(long)&local_270);
          if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
            std::ostream::write((char *)&local_228,(long)local_268);
            if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
              bVar2 = true;
              std::ofstream::close();
              goto LAB_0010449a;
            }
          }
        }
      }
      else {
        std::ostream::write((char *)&local_228,
                            (long)(this->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) goto LAB_00104404;
        lVar4 = 0x16;
        pcVar5 = "can\'t unload raw data\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
      std::ofstream::close();
    }
    else {
      std::ofstream::close();
      lVar4 = 0x18;
      pcVar5 = "can\'t dump the tga file\n";
LAB_0010433e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    }
  }
  bVar2 = false;
LAB_0010449a:
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return bVar2;
}

Assistant:

bool TGAImage::write_tga_file(const std::string filename, const bool v_flip, const bool rle) const
{
    std::uint8_t developer_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t extension_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                               'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
    std::ofstream out;
    out.open(filename, std::ios::binary);
    if (!out.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        out.close();
        return false;
    }
    TGA_Header header;
    header.bitsperpixel = bytespp << 3;
    header.width = width;
    header.height = height;
    header.datatypecode = (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
    header.imagedescriptor = v_flip ? 0x00 : 0x20;  // top-left or bottom-left origin
    out.write(reinterpret_cast<const char *>(&header), sizeof(header));
    if (!out.good()) {
        out.close();
        std::cerr << "can't dump the tga file\n";
        return false;
    }
    if (!rle) {
        out.write(reinterpret_cast<const char *>(data.data()), width * height * bytespp);
        if (!out.good()) {
            std::cerr << "can't unload raw data\n";
            out.close();
            return false;
        }
    } else {
        if (!unload_rle_data(out)) {
            out.close();
            std::cerr << "can't unload rle data\n";
            return false;
        }
    }
    out.write(reinterpret_cast<const char *>(developer_area_ref), sizeof(developer_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(extension_area_ref), sizeof(extension_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(footer), sizeof(footer));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.close();
    return true;
}